

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  void *pvVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  bool bVar4;
  uint64_t uVar5;
  ulong uVar6;
  size_t hash;
  uint64_t v;
  ctrl_t cVar7;
  ulong uVar8;
  undefined8 old_slot;
  size_t sVar9;
  FindInfo FVar10;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  undefined2 local_37;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_40 = common->capacity_;
    local_38 = (byte)common->size_ & 1;
    local_37 = 0;
    local_50.heap.control = (common->heap_or_soo_).heap.control;
    local_50.heap.slot_array =
         (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
    CommonFields::set_capacity(common,new_capacity);
    bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,48ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_50,common,&local_51,0xffffff80,0x20,0x30);
    if (local_40 != 0) {
      if (bVar4) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,void>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                  ((HashSetResizeHelper *)&local_50.heap,common,
                   (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
                    *)common);
      }
      else {
        if ((char)local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          pvVar1 = (common->heap_or_soo_).heap.slot_array.p;
          sVar9 = 0;
          old_slot = local_50.heap.slot_array;
          do {
            if ((char)local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_50.heap.control[sVar9]) {
              uVar2 = *(size_type *)(old_slot + 8);
              uVar5 = hash_internal::MixingHashState::CombineContiguousImpl
                                (&hash_internal::MixingHashState::kSeed,*(undefined8 *)old_slot,
                                 uVar2);
              uVar8 = (uVar5 ^ uVar2) * -0x234dd359734ecb13;
              FVar10 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                                   (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                                   (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                                   (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38),hash);
              uVar6 = FVar10.offset;
              uVar2 = common->capacity_;
              if (uVar2 <= uVar6) {
                __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x744,
                              "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                             );
              }
              cVar7 = (ctrl_t)(uVar8 >> 0x38) & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar6] = cVar7;
              pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar6 - 0xf & uVar2)] = cVar7;
              common->capacity_ = 0xffffffffffffff9c;
              map_slot_policy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>::
              transfer<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                        ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
                          *)common,(slot_type *)(uVar6 * 0x30 + (long)pvVar1),(slot_type *)old_slot)
              ;
              CommonFields::set_capacity(common,uVar2);
            }
            sVar9 = sVar9 + 1;
            old_slot = old_slot + 0x30;
          } while (sVar9 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_50,&local_52,0x30);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }